

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblemenu.cpp
# Opt level: O0

State __thiscall QAccessibleMenuItem::state(QAccessibleMenuItem *this)

{
  long lVar1;
  bool bVar2;
  QWidget *pQVar3;
  QMenu *pQVar4;
  QMenuBar *pQVar5;
  QStyle *pQVar6;
  ulong uVar7;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QMenuBar *menuBar;
  QMenu *menu;
  QWidget *own;
  State s;
  QWidget *in_stack_ffffffffffffffb8;
  QMenuBar *in_stack_ffffffffffffffc0;
  State local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QAccessible::State::State((State *)0x7dbb2b);
  pQVar3 = owner((QAccessibleMenuItem *)0x7dbb35);
  if ((pQVar3 != (QWidget *)0x0) &&
     (bVar2 = QWidget::testAttribute
                        (in_RDI,(WidgetAttribute)((ulong)in_stack_ffffffffffffffc0 >> 0x20)), bVar2)
     ) {
    QAction::isVisible();
  }
  pQVar4 = qobject_cast<QMenu*>((QObject *)0x7dbb8f);
  if (pQVar4 == (QMenu *)0x0) {
    pQVar5 = qobject_cast<QMenuBar*>((QObject *)0x7dbbcb);
    if (pQVar5 != (QMenuBar *)0x0) {
      QMenuBar::activeAction(in_stack_ffffffffffffffc0);
    }
  }
  else {
    QMenu::activeAction((QMenu *)0x7dbba6);
  }
  if (pQVar3 != (QWidget *)0x0) {
    pQVar6 = QWidget::style(in_stack_ffffffffffffffb8);
    (**(code **)(*(long *)pQVar6 + 0xf0))(pQVar6,0x14,0,pQVar3);
  }
  local_10 = (State)&DAT_aaaaaaaaaaaaaaaa;
  uVar7 = QAction::isSeparator();
  if (((uVar7 & 1) != 0) || (uVar7 = QAction::isEnabled(), (uVar7 & 1) == 0)) {
    local_10 = (State)0xaaaaaaaaaaaaaaab;
  }
  uVar7 = QAction::isChecked();
  if ((uVar7 & 1) != 0) {
    local_10 = (State)((ulong)local_10 | 0x40);
  }
  uVar7 = QAction::isCheckable();
  if ((uVar7 & 1) != 0) {
    local_10 = (State)((ulong)local_10 & 0xffffffffffffffdf | 0x20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

QAccessible::State QAccessibleMenuItem::state() const
{
    QAccessible::State s;
    QWidget *own = owner();

    if (own && (own->testAttribute(Qt::WA_WState_Visible) == false || m_action->isVisible() == false)) {
        s.invisible = true;
    }

    if (QMenu *menu = qobject_cast<QMenu*>(own)) {
        if (menu->activeAction() == m_action)
            s.focused = true;
#if QT_CONFIG(menubar)
    } else if (QMenuBar *menuBar = qobject_cast<QMenuBar*>(own)) {
        if (menuBar->activeAction() == m_action)
            s.focused = true;
#endif
    }
    if (own && own->style()->styleHint(QStyle::SH_Menu_MouseTracking, nullptr, own))
        s.hotTracked = true;
    if (m_action->isSeparator() || !m_action->isEnabled())
        s.disabled = true;
    if (m_action->isChecked())
        s.checked = true;
    if (m_action->isCheckable())
        s.checkable = true;

    return s;
}